

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
          (ConfidentialTransactionContext *this,uint32_t version,uint32_t locktime)

{
  _Rb_tree_header *p_Var1;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            (&this->super_ConfidentialTransaction,version,locktime);
  *(undefined ***)this = &PTR__ConfidentialTransactionContext_002cf260;
  (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->signed_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->verify_map_).super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verify_map_).super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->verify_map_).super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->verify_ignore_map_).
  super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verify_ignore_map_).
  super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->verify_ignore_map_).
  super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ConfidentialTransactionContext::ConfidentialTransactionContext(
    uint32_t version, uint32_t locktime)
    : ConfidentialTransaction(version, locktime) {}